

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

void __thiscall ncnn::ParamDict::ParamDict(ParamDict *this,ParamDict *rhs)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  int iVar3;
  ParamDictPrivate *pPVar4;
  int *piVar5;
  long *plVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  ParamDictPrivate *pPVar11;
  undefined8 *puVar12;
  long lVar13;
  
  this->_vptr_ParamDict = (_func_int **)&PTR__ParamDict_00599488;
  pPVar11 = (ParamDictPrivate *)operator_new(0xe00);
  ParamDictPrivate::ParamDictPrivate(pPVar11);
  this->d = pPVar11;
  for (lVar13 = 0x50; lVar13 != 0xe50; lVar13 = lVar13 + 0x70) {
    pPVar11 = rhs->d;
    iVar3 = *(int *)((long)pPVar11->params + lVar13 + -0x50);
    pPVar4 = this->d;
    *(int *)((long)pPVar4->params + lVar13 + -0x50) = iVar3;
    if (iVar3 - 1U < 3) {
      *(undefined4 *)((long)pPVar4->params + lVar13 + -0x4c) =
           *(undefined4 *)((long)pPVar11->params + lVar13 + -0x4c);
    }
    else if (iVar3 == 7) {
      std::__cxx11::string::_M_assign((string *)((long)&pPVar4->params[0].type + lVar13));
    }
    else if (pPVar4 != pPVar11) {
      piVar5 = *(int **)((long)pPVar11->params + lVar13 + -0x40);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = *(int **)((long)pPVar4->params + lVar13 + -0x40);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          plVar6 = *(long **)((long)pPVar4->params + lVar13 + -0x28);
          if (plVar6 == (long *)0x0) {
            free(*(void **)((long)pPVar4->params + lVar13 + -0x48));
          }
          else {
            (**(code **)(*plVar6 + 0x18))();
          }
        }
      }
      puVar12 = (undefined8 *)((long)pPVar4->params + lVar13 + -0x48);
      *(undefined8 *)((long)pPVar4->params + lVar13 + -8) = 0;
      *(undefined8 *)((long)pPVar4->params + lVar13 + -0x3c) = 0;
      *(undefined8 *)((long)pPVar4->params + lVar13 + -0x34) = 0;
      *puVar12 = 0;
      *(undefined8 *)((long)pPVar4->params + lVar13 + -0x40) = 0;
      *(undefined4 *)((long)pPVar4->params + lVar13 + -0x10) = 0;
      *(undefined8 *)((long)pPVar4->params + lVar13 + -0x20) = 0;
      *(undefined8 *)((long)pPVar4->params + lVar13 + -0x18) = 0;
      puVar1 = (undefined8 *)((long)pPVar11->params + lVar13 + -0x48);
      uVar10 = puVar1[1];
      *puVar12 = *puVar1;
      *(undefined8 *)((long)pPVar4->params + lVar13 + -0x40) = uVar10;
      *(undefined8 *)((long)pPVar4->params + lVar13 + -0x38) =
           *(undefined8 *)((long)pPVar11->params + lVar13 + -0x38);
      *(undefined4 *)((long)pPVar4->params + lVar13 + -0x30) =
           *(undefined4 *)((long)pPVar11->params + lVar13 + -0x30);
      *(undefined8 *)((long)pPVar4->params + lVar13 + -0x28) =
           *(undefined8 *)((long)pPVar11->params + lVar13 + -0x28);
      puVar2 = (undefined4 *)((long)pPVar11->params + lVar13 + -0x20);
      uVar7 = puVar2[1];
      uVar8 = puVar2[2];
      uVar9 = puVar2[3];
      *(undefined4 *)((long)pPVar4->params + lVar13 + -0x20) = *puVar2;
      *(undefined4 *)((long)pPVar4->params + lVar13 + -0x1c) = uVar7;
      *(undefined4 *)((long)pPVar4->params + lVar13 + -0x18) = uVar8;
      *(undefined4 *)((long)pPVar4->params + lVar13 + -0x14) = uVar9;
      *(undefined4 *)((long)pPVar4->params + lVar13 + -0x10) =
           *(undefined4 *)((long)pPVar11->params + lVar13 + -0x10);
      *(undefined8 *)((long)pPVar4->params + lVar13 + -8) =
           *(undefined8 *)((long)pPVar11->params + lVar13 + -8);
    }
  }
  return;
}

Assistant:

ParamDict::ParamDict(const ParamDict& rhs)
    : d(new ParamDictPrivate)
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        int type = rhs.d->params[i].type;
        d->params[i].type = type;
        if (type == 1 || type == 2 || type == 3)
        {
            d->params[i].i = rhs.d->params[i].i;
        }
        else if (type == 7)
        {
            d->params[i].s = rhs.d->params[i].s;
        }
        else // if (type == 4 || type == 5 || type == 6)
        {
            d->params[i].v = rhs.d->params[i].v;
        }
    }
}